

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O2

QTextDocumentFragment * __thiscall
QTextDocumentFragment::operator=(QTextDocumentFragment *this,QTextDocumentFragment *rhs)

{
  QTextDocumentFragmentPrivate *pQVar1;
  
  pQVar1 = rhs->d;
  if (pQVar1 != (QTextDocumentFragmentPrivate *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar1 = this->d;
  if (pQVar1 != (QTextDocumentFragmentPrivate *)0x0) {
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar1 = this->d;
      if ((pQVar1 != (QTextDocumentFragmentPrivate *)0x0) && (pQVar1->doc != (QTextDocument *)0x0))
      {
        (**(code **)(*(long *)pQVar1->doc + 0x20))();
      }
      operator_delete(pQVar1,0x18);
    }
  }
  this->d = rhs->d;
  return this;
}

Assistant:

QTextDocumentFragment &QTextDocumentFragment::operator=(const QTextDocumentFragment &rhs)
{
    if (rhs.d)
        rhs.d->ref.ref();
    if (d && !d->ref.deref())
        delete d;
    d = rhs.d;
    return *this;
}